

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

void Vec_WecRemoveEmpty(Vec_Wec_t *vCubes)

{
  Vec_Int_t *pVVar1;
  int i;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int i_00;
  int iVar6;
  
  iVar6 = 0;
  for (i_00 = 0; iVar3 = vCubes->nSize, i = iVar6, i_00 < iVar3; i_00 = i_00 + 1) {
    pVVar4 = Vec_WecEntry(vCubes,i_00);
    if (pVVar4->nSize < 1) {
      if (pVVar4->pArray != (int *)0x0) {
        free(pVVar4->pArray);
        pVVar4->pArray = (int *)0x0;
      }
    }
    else {
      lVar5 = (long)iVar6;
      iVar6 = iVar6 + 1;
      iVar3 = pVVar4->nSize;
      piVar2 = pVVar4->pArray;
      pVVar1 = vCubes->pArray + lVar5;
      pVVar1->nCap = pVVar4->nCap;
      pVVar1->nSize = iVar3;
      pVVar1->pArray = piVar2;
    }
  }
  for (; i < iVar3; i = i + 1) {
    pVVar4 = Vec_WecEntry(vCubes,i);
    pVVar4->nCap = 0;
    pVVar4->nSize = 0;
    pVVar4->pArray = (int *)0x0;
    iVar3 = vCubes->nSize;
  }
  if (iVar3 < iVar6) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0xfa,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = iVar6;
  return;
}

Assistant:

static inline void Vec_WecRemoveEmpty( Vec_Wec_t * vCubes )
{
    Vec_Int_t * vCube;
    int i, k = 0;
    Vec_WecForEachLevel( vCubes, vCube, i )
        if ( Vec_IntSize(vCube) > 0 )
            vCubes->pArray[k++] = *vCube;
        else
            ABC_FREE( vCube->pArray );
    for ( i = k; i < Vec_WecSize(vCubes); i++ )
        Vec_IntZero( Vec_WecEntry(vCubes, i) );
    Vec_WecShrink( vCubes, k );
//    Vec_WecSortByFirstInt( vCubes, 0 );
}